

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::Stdout(string *s)

{
  bool bVar1;
  ostream *this;
  string *s_local;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function *)(anonymous_namespace)::s_StdoutCallback_abi_cxx11_);
  if (bVar1) {
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)(anonymous_namespace)::s_StdoutCallback_abi_cxx11_,s);
  }
  else {
    this = std::operator<<((ostream *)&std::cout,(string *)s);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void cmSystemTools::Stdout(const std::string& s)
{
  if (s_StdoutCallback) {
    s_StdoutCallback(s);
  } else {
    std::cout << s << std::flush;
  }
}